

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdCheck.c
# Opt level: O2

int Dsd_CheckRootFunctionIdentity_rec(DdManager *dd,DdNode *bF1,DdNode *bF2,DdNode *bC1,DdNode *bC2)

{
  Dsd_Entry_t *pDVar1;
  ulong uVar2;
  Dds_Cache_t *pDVar3;
  int iVar4;
  int iVar5;
  DdNode **ppDVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  ulong uVar12;
  DdNode *g;
  DdNode **ppDVar13;
  DdNode *pDVar14;
  DdNode *bT [4];
  int CurLevel [4];
  DdNode *bE [4];
  DdNode *bA [4];
  DdNode *bAR [4];
  DdNode *local_b8 [4];
  int local_98 [4];
  DdNode *local_88 [4];
  DdNode *local_68 [4];
  uint *local_48 [5];
  
  ppDVar6 = local_b8;
  pDVar14 = dd->one;
  pDVar11 = (DdNode *)((ulong)pDVar14 ^ 1);
  if (pDVar11 == bC1) {
    __assert_fail("bC1 != b0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdCheck.c"
                  ,0xa0,
                  "int Dsd_CheckRootFunctionIdentity_rec(DdManager *, DdNode *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  if (pDVar11 == bC2) {
    __assert_fail("bC2 != b0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdCheck.c"
                  ,0xa1,
                  "int Dsd_CheckRootFunctionIdentity_rec(DdManager *, DdNode *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  if (pDVar14 == bC2 && pDVar14 == bC1) {
    return (uint)(bF1 == bF2);
  }
  pDVar10 = bC2;
  if (pDVar11 == bF1) {
    g = (DdNode *)((ulong)bF2 ^ 1);
LAB_0074c0fe:
    iVar5 = Cudd_bddLeq(dd,pDVar10,g);
    return iVar5;
  }
  g = bF2;
  if (pDVar14 == bF1) goto LAB_0074c0fe;
  pDVar10 = bC1;
  if (pDVar11 == bF2) {
    g = (DdNode *)((ulong)bF1 ^ 1);
    goto LAB_0074c0fe;
  }
  g = bF1;
  if (pDVar14 == bF2) goto LAB_0074c0fe;
  pDVar1 = pCache->pTable;
  uVar8 = (ulong)(((((long)&bF1->index + (long)&bF2->index) * 0xc00005 + (long)bC1) * 0x40f1f9 +
                  (long)bC2) * 0xb5051) % (ulong)(long)pCache->nTableSize & 0xffffffff;
  if ((((pDVar1[uVar8].bX[0] == bF1) && (pDVar1[uVar8].bX[1] == bF2)) &&
      (pDVar1[uVar8].bX[2] == bC1)) && (pDVar1[uVar8].bX[3] == bC2)) {
    pCache->nSuccess = pCache->nSuccess + 1;
    return *(int *)(pDVar1[uVar8].bX + 4);
  }
  local_68[0] = bF1;
  local_68[1] = bF2;
  local_68[2] = bC1;
  local_68[3] = bC2;
  local_48[0] = (uint *)((ulong)bF1 & 0xfffffffffffffffe);
  local_48[1] = (uint *)((ulong)bF2 & 0xfffffffffffffffe);
  local_48[2] = (uint *)((ulong)bC1 & 0xfffffffffffffffe);
  local_48[3] = (uint *)((ulong)bC2 & 0xfffffffffffffffe);
  uVar12 = (ulong)*(uint *)((ulong)bF1 & 0xfffffffffffffffe);
  local_98[1] = 0x7fffffff;
  local_98[0] = 0x7fffffff;
  if (uVar12 != 0x7fffffff) {
    local_98[0] = dd->perm[uVar12];
  }
  uVar12 = (ulong)*(uint *)((ulong)bF2 & 0xfffffffffffffffe);
  if (uVar12 != 0x7fffffff) {
    local_98[1] = dd->perm[uVar12];
  }
  uVar12 = (ulong)*(uint *)((ulong)bC1 & 0xfffffffffffffffe);
  iVar4 = 0x7fffffff;
  iVar5 = 0x7fffffff;
  if (uVar12 != 0x7fffffff) {
    iVar5 = dd->perm[uVar12];
  }
  local_98[2] = iVar5;
  uVar12 = (ulong)*(uint *)((ulong)bC2 & 0xfffffffffffffffe);
  if (uVar12 != 0x7fffffff) {
    iVar4 = dd->perm[uVar12];
  }
  local_98[3] = iVar4;
  pCache->nFailure = pCache->nFailure + 1;
  iVar7 = 0x7fffffff;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    if (local_98[lVar9] <= iVar7) {
      iVar7 = local_98[lVar9];
    }
  }
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
    uVar12 = *(ulong *)((long)local_68 + lVar9 * 2);
    if (iVar7 == *(int *)((long)local_98 + lVar9)) {
      uVar2 = *(ulong *)((long)local_48 + lVar9 * 2);
      if (uVar12 == uVar2) {
        *(ulong *)((long)local_88 + lVar9 * 2) = *(ulong *)(uVar2 + 0x18);
        uVar12 = *(ulong *)(uVar2 + 0x10);
        ppDVar13 = local_b8;
      }
      else {
        *(ulong *)((long)local_88 + lVar9 * 2) = *(ulong *)(uVar2 + 0x18) ^ 1;
        uVar12 = *(ulong *)(uVar2 + 0x10) ^ 1;
        ppDVar13 = local_b8;
      }
    }
    else {
      *(ulong *)((long)local_b8 + lVar9 * 2) = uVar12;
      ppDVar13 = local_88;
    }
    *(ulong *)((long)ppDVar13 + lVar9 * 2) = uVar12;
  }
  if ((iVar7 == iVar5) && (iVar7 == iVar4)) {
    ppDVar6 = local_88;
    if (local_88[2] == pDVar11) {
      ppDVar6 = local_b8;
      local_88[2] = local_b8[2];
    }
    local_b8[0] = *ppDVar6;
    ppDVar6 = local_88;
    if (local_88[3] == pDVar11) {
      ppDVar6 = local_b8;
    }
    local_b8[1] = ppDVar6[1];
    if (local_88[3] == pDVar11) {
      local_88[3] = local_b8[3];
    }
  }
  else {
    if ((iVar7 == iVar5) && (iVar7 != iVar4)) {
      pDVar14 = local_b8[2];
      if (local_88[2] != pDVar11) {
        ppDVar6 = local_88;
        pDVar14 = local_88[2];
      }
      pDVar11 = *ppDVar6;
      iVar5 = Dsd_CheckRootFunctionIdentity_rec(dd,pDVar11,local_88[1],pDVar14,local_88[3]);
      local_b8[0] = pDVar11;
      local_88[2] = pDVar14;
      local_88[3] = local_b8[3];
    }
    else if ((iVar7 == iVar5) || (iVar7 != iVar4)) {
      iVar5 = Dsd_CheckRootFunctionIdentity_rec(dd,local_88[0],local_88[1],local_88[2],local_88[3]);
      local_88[2] = local_b8[2];
      local_88[3] = local_b8[3];
    }
    else {
      pDVar14 = local_88[3];
      ppDVar6 = local_88;
      if (local_88[3] == pDVar11) {
        pDVar14 = local_b8[3];
        ppDVar6 = local_b8;
      }
      local_b8[1] = ppDVar6[1];
      iVar5 = Dsd_CheckRootFunctionIdentity_rec(dd,local_88[0],local_b8[1],local_88[2],pDVar14);
      local_88[2] = local_b8[2];
      local_88[3] = pDVar14;
    }
    if (iVar5 != 1) goto LAB_0074c0c1;
  }
  iVar5 = Dsd_CheckRootFunctionIdentity_rec(dd,local_b8[0],local_b8[1],local_88[2],local_88[3]);
LAB_0074c0c1:
  pDVar3 = pCache;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    pDVar3->pTable[uVar8].bX[lVar9] = local_68[lVar9];
  }
  pDVar3->pTable[uVar8].bX[4] = (DdNode *)(long)iVar5;
  return iVar5;
}

Assistant:

int Dsd_CheckRootFunctionIdentity_rec( DdManager * dd, DdNode * bF1, DdNode * bF2, DdNode * bC1, DdNode * bC2 )
{
    unsigned HKey;

    // if either bC1 or bC2 is zero, the test is true
//  if ( bC1 == b0 || bC2 == b0 )  return 1;
    assert( bC1 != b0 );
    assert( bC2 != b0 );

    // if both bC1 and bC2 are one - perform comparison
    if ( bC1 == b1 && bC2 == b1 )  return (int)( bF1 == bF2 );

    if ( bF1 == b0 )
        return Cudd_bddLeq( dd, bC2, Cudd_Not(bF2) );

    if ( bF1 == b1 )
        return Cudd_bddLeq( dd, bC2, bF2 );

    if ( bF2 == b0 )
        return Cudd_bddLeq( dd, bC1, Cudd_Not(bF1) );

    if ( bF2 == b1 )
        return Cudd_bddLeq( dd, bC1, bF1 );

    // otherwise, keep expanding

    // check cache
//  HKey = _Hash( ((unsigned)bF1), ((unsigned)bF2), ((unsigned)bC1), ((unsigned)bC2) );
    HKey = hashKey4( bF1, bF2, bC1, bC2, pCache->nTableSize );
    if ( pCache->pTable[HKey].bX[0] == bF1 && 
         pCache->pTable[HKey].bX[1] == bF2 && 
         pCache->pTable[HKey].bX[2] == bC1 && 
         pCache->pTable[HKey].bX[3] == bC2 )
    {
        pCache->nSuccess++;
        return (int)(ABC_PTRUINT_T)pCache->pTable[HKey].bX[4]; // the last bit records the result (yes/no)
    }
    else
    {

        // determine the top variables
        int RetValue;
        DdNode * bA[4]  = { bF1, bF2, bC1, bC2 }; // arguments
        DdNode * bAR[4] = { Cudd_Regular(bF1), Cudd_Regular(bF2), Cudd_Regular(bC1), Cudd_Regular(bC2) }; // regular arguments
        int CurLevel[4] = { cuddI(dd,bAR[0]->index), cuddI(dd,bAR[1]->index), cuddI(dd,bAR[2]->index), cuddI(dd,bAR[3]->index) };
        int TopLevel = CUDD_CONST_INDEX;
        int i;
        DdNode * bE[4], * bT[4];
        DdNode * bF1next, * bF2next, * bC1next, * bC2next;

        pCache->nFailure++;

        // determine the top level
        for ( i = 0; i < 4; i++ )
            if ( TopLevel > CurLevel[i] )
                 TopLevel = CurLevel[i];

        // compute the cofactors
        for ( i = 0; i < 4; i++ )
        if ( TopLevel == CurLevel[i] )
        {
            if ( bA[i] != bAR[i] ) // complemented
            {
                bE[i] = Cudd_Not(cuddE(bAR[i]));
                bT[i] = Cudd_Not(cuddT(bAR[i]));
            }
            else
            {
                bE[i] = cuddE(bAR[i]);
                bT[i] = cuddT(bAR[i]);
            }
        }
        else
            bE[i] = bT[i] = bA[i];

        // solve subproblems
        // three cases are possible

        // (1) the top var belongs to both C1 and C2
        //     in this case, any cofactor of F1 and F2 will do, 
        //     as long as the corresponding cofactor of C1 and C2 is not equal to 0
        if ( TopLevel == CurLevel[2] && TopLevel == CurLevel[3] ) 
        {
            if ( bE[2] != b0 ) // C1
            {
                bF1next = bE[0];
                bC1next = bE[2];
            }
            else
            {
                bF1next = bT[0];
                bC1next = bT[2];
            }
            if ( bE[3] != b0 ) // C2
            {
                bF2next = bE[1];
                bC2next = bE[3];
            }
            else
            {
                bF2next = bT[1];
                bC2next = bT[3];
            }
            RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bF1next, bF2next, bC1next, bC2next );
        }
        // (2) the top var belongs to either C1 or C2
        //     in this case normal splitting of cofactors
        else if ( TopLevel == CurLevel[2] && TopLevel != CurLevel[3] ) 
        {
            if ( bE[2] != b0 ) // C1
            {
                bF1next = bE[0];
                bC1next = bE[2];
            }
            else
            {
                bF1next = bT[0];
                bC1next = bT[2];
            }
            // split around this variable
            RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bF1next, bE[1], bC1next, bE[3] );
            if ( RetValue == 1 ) // test another branch; otherwise, there is no need to test
                RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bF1next, bT[1], bC1next, bT[3] );
        }
        else if ( TopLevel != CurLevel[2] && TopLevel == CurLevel[3] ) 
        {
            if ( bE[3] != b0 ) // C2
            {
                bF2next = bE[1];
                bC2next = bE[3];
            }
            else
            {
                bF2next = bT[1];
                bC2next = bT[3];
            }
            // split around this variable
            RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bE[0], bF2next, bE[2], bC2next );
            if ( RetValue == 1 ) // test another branch; otherwise, there is no need to test
                RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bT[0], bF2next, bT[2], bC2next );
        }
        // (3) the top var does not belong to C1 and C2
        //     in this case normal splitting of cofactors
        else // if ( TopLevel != CurLevel[2] && TopLevel != CurLevel[3] )
        {
            // split around this variable
            RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bE[0], bE[1], bE[2], bE[3] );
            if ( RetValue == 1 ) // test another branch; otherwise, there is no need to test
                RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bT[0], bT[1], bT[2], bT[3] );
        }

        // set cache
        for ( i = 0; i < 4; i++ )
            pCache->pTable[HKey].bX[i] = bA[i];
        pCache->pTable[HKey].bX[4] = (DdNode*)(ABC_PTRUINT_T)RetValue;

        return RetValue;
    }
}